

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Vec2f __thiscall embree::XMLLoader::load<embree::Vec2<float>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  Vec2f VVar1;
  runtime_error *this_01;
  long *plVar2;
  long *plVar3;
  long *in_RDX;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0x90) {
    fVar4 = Token::Float(this_00,true);
    fVar5 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    *(float *)&(this->path).filename._M_dataplus._M_p = fVar4;
    *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = fVar5;
    VVar1.field_0.field_0.y = (float)extraout_XMM0_Db;
    VVar1.field_0.field_0.x = fVar5;
    return (Vec2f)VVar1.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_40,(ParseLocation *)(*in_RDX + 0x10));
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_60 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_60 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_60);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec2f XMLLoader::load<Vec2f>(const Ref<XML>& xml) {
    if (xml->body.size() != 2) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float2 body");
    return Vec2f(xml->body[0].Float(),xml->body[1].Float());
  }